

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

string * __thiscall
LiteScript::_Type_ARRAY::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_ARRAY *this,Variable *object)

{
  Array *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Object *pOVar5;
  ostream *poVar6;
  size_t sVar7;
  Type *this_01;
  char *__s;
  ulong uVar8;
  uint idx;
  Variable v;
  stringstream ss;
  string local_1e8;
  undefined1 local_1c8 [32];
  pointer local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
  pOVar5 = Variable::operator->(object);
  this_00 = (Array *)pOVar5->data;
  uVar3 = Array::UnamedCount(this_00);
  if (uVar3 != 0) {
    uVar8 = 0;
    do {
      iVar4 = Array::ExistUnamed(this_00,(uint)uVar8);
      if (iVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]:",2);
        Array::ConstantGet((Array *)local_1c8,(uint)this_00);
        Variable::operator_cast_to_string(&local_1e8,(Variable *)local_1c8);
        _Var1._M_p = local_1e8._M_dataplus._M_p;
        if (local_1e8._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar7 = strlen(local_1e8._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,_Var1._M_p,sVar7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        Variable::~Variable((Variable *)local_1c8);
        if (uVar8 < uVar3 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  uVar3 = Array::UnamedCount(this_00);
  if (uVar3 != 0) {
    uVar3 = Array::NamedCount(this_00);
    if (uVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
    }
  }
  uVar3 = Array::NamedCount(this_00);
  if (uVar3 != 0) {
    idx = 0;
    do {
      Array::GetNamedVariable((Array *)local_1c8,(uint)this_00);
      pOVar5 = Variable::operator->((Variable *)local_1c8);
      this_01 = Object::GetType(pOVar5);
      bVar2 = Type::operator!=(this_01,(Type *)_type_undefined);
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[\'",2);
        __s = Array::GetNamedKey(this_00,idx);
        if (__s == (char *)0x0) {
          std::ios::clear((int)local_1a8 + (int)local_1a8[0][-2].nb_ref);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\']:",3);
        Variable::operator_cast_to_string(&local_1e8,(Variable *)local_1c8);
        _Var1._M_p = local_1e8._M_dataplus._M_p;
        if (local_1e8._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)local_1a8 + (int)local_1a8[0][-2].nb_ref);
        }
        else {
          sVar7 = strlen(local_1e8._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,_Var1._M_p,sVar7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        if (idx < uVar3 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        }
      }
      Variable::~Variable((Variable *)local_1c8);
      idx = idx + 1;
    } while (uVar3 != idx);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_ARRAY::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Array& obj = object->GetData<Array>();
    for (unsigned int i = 0, sz = obj.UnamedCount(); i < sz; i++) {
        if (obj.ExistUnamed(i)) {
            ss << "[" << i << "]:" << ((std::string) (obj.ConstantGet(i))).c_str();
            if (i < sz - 1)
                ss << ",";
        }
    }
    if (obj.UnamedCount() > 0 && obj.NamedCount() > 0)
        ss << ",";
    for (unsigned int i = 0, sz = obj.NamedCount(); i < sz; i++) {
        Variable v = obj.GetNamedVariable(i);
        if (v->GetType() != Type::UNDEFINED) {
            ss << "['" << obj.GetNamedKey(i) << "']:" << ((std::string) (v)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
    }
    ss << "}";
    return ss.str();
}